

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

double __thiscall despot::TagManhattanUpperBound::Value(TagManhattanUpperBound *this,Belief *belief)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  double dVar4;
  
  plVar2 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  dVar4 = 0.0;
  for (lVar3 = 0; plVar2[1] - *plVar2 >> 3 != lVar3; lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(*plVar2 + lVar3 * 8);
    dVar4 = dVar4 + *(double *)(lVar1 + 0x18) *
                    (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[*(int *)(lVar1 + 0xc)];
  }
  return dVar4;
}

Assistant:

double Value(const Belief* belief) const {
		const vector<State*>& particles =
			static_cast<const ParticleBelief*>(belief)->particles();

		double value = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			const TagState* state = static_cast<const TagState*>(particle);
			value += state->weight * value_[state->state_id];
		}
		return value;
	}